

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

QStringList * QCoreApplication::libraryPaths(void)

{
  Type *pTVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [16];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
           instance();
  local_20._0_8_ = &pTVar1->libraryPathMutex;
  QRecursiveMutex::lock((QRecursiveMutex *)local_20._0_8_);
  local_20[8] = true;
  libraryPathsLocked();
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCoreApplication::libraryPaths()
{
    QMutexLocker locker(&coreappdata->libraryPathMutex);
    return libraryPathsLocked();
}